

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader15.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::FormulasLoader15::begin__coth
          (FormulasLoader15 *this,coth__AttributeData *attributeData)

{
  int iVar1;
  uint local_240 [2];
  ParserChar *local_238;
  URI local_230;
  ParserString *local_148;
  size_t sStack_140;
  ParserChar *local_138;
  ParserChar *pPStack_130;
  ParserChar *local_128;
  URI local_120;
  char **local_38;
  size_t sStack_30;
  
  COLLADABU::URI::URI(&local_230);
  local_148 = (ParserString *)0x0;
  sStack_140 = 0;
  COLLADABU::URI::URI(&local_120);
  local_138 = attributeData->style;
  pPStack_130 = attributeData->xref;
  local_128 = attributeData->id;
  local_238 = attributeData->encoding;
  local_38 = (attributeData->unknownAttributes).data;
  sStack_30 = (attributeData->unknownAttributes).size;
  local_240[0] = 0;
  if ((attributeData->present_attributes & 1) != 0) {
    COLLADABU::URI::operator=(&local_230,&attributeData->definitionURL);
    local_240[0] = local_240[0] | 1;
  }
  if ((attributeData->present_attributes & 2) != 0) {
    local_148 = (attributeData->_class).data;
    sStack_140 = (attributeData->_class).size;
    local_240[0] = local_240[0] | 2;
  }
  if ((attributeData->present_attributes & 4) != 0) {
    COLLADABU::URI::operator=(&local_120,&attributeData->href);
    local_240[0] = local_240[0] | 4;
  }
  iVar1 = (*(this->mLoader->super_HelperLoaderBase)._vptr_HelperLoaderBase[0x94])
                    (this->mLoader,local_240);
  COLLADABU::URI::~URI(&local_120);
  COLLADABU::URI::~URI(&local_230);
  return SUB41(iVar1,0);
}

Assistant:

bool FormulasLoader15::begin__coth( const COLLADASaxFWL15::coth__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__coth(attributeData));
COLLADASaxFWL::coth__AttributeData attrData;
attrData.style = attributeData.style;
attrData.xref = attributeData.xref;
attrData.id = attributeData.id;
attrData.encoding = attributeData.encoding;
attrData.unknownAttributes = attributeData.unknownAttributes;
attrData.present_attributes = 0;
if ( (attributeData.present_attributes & COLLADASaxFWL15::coth__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT) == COLLADASaxFWL15::coth__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT ) {
    attrData.definitionURL = attributeData.definitionURL;
    attrData.present_attributes |= COLLADASaxFWL::coth__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT;
}
if ( (attributeData.present_attributes & COLLADASaxFWL15::coth__AttributeData::ATTRIBUTE__CLASS_PRESENT) == COLLADASaxFWL15::coth__AttributeData::ATTRIBUTE__CLASS_PRESENT ) {
    attrData._class = attributeData._class;
    attrData.present_attributes |= COLLADASaxFWL::coth__AttributeData::ATTRIBUTE__CLASS_PRESENT;
}
if ( (attributeData.present_attributes & COLLADASaxFWL15::coth__AttributeData::ATTRIBUTE_HREF_PRESENT) == COLLADASaxFWL15::coth__AttributeData::ATTRIBUTE_HREF_PRESENT ) {
    attrData.href = attributeData.href;
    attrData.present_attributes |= COLLADASaxFWL::coth__AttributeData::ATTRIBUTE_HREF_PRESENT;
}
return mLoader->begin__coth(attrData);
}